

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.h
# Opt level: O2

void __thiscall
chrono::ChTimestepperIIorder::SetIntegrable(ChTimestepperIIorder *this,ChIntegrableIIorder *intgr)

{
  (this->super_ChTimestepper).integrable = &intgr->super_ChIntegrable;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->X,1);
  (this->X).integrable = &intgr->super_ChIntegrable;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->V,1);
  (this->V).integrable = &intgr->super_ChIntegrable;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->A,1);
  (this->A).integrable = &intgr->super_ChIntegrable;
  return;
}

Assistant:

virtual void SetIntegrable(ChIntegrableIIorder* intgr) {
        ChTimestepper::SetIntegrable(intgr);
        X.setZero(1, intgr);
        V.setZero(1, intgr);
        A.setZero(1, intgr);
    }